

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cpp
# Opt level: O3

void al_print(LogLevel level,FILE *logfile,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  char *__s;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  vector<char> dynmsg;
  va_list args2;
  va_list args;
  char stcmsg [256];
  vector<char,_al::allocator<char,_1UL>_> local_238;
  undefined8 local_218;
  pointer *local_210;
  undefined1 *local_208;
  undefined8 local_1f8;
  pointer *local_1f0;
  undefined1 *local_1e8;
  undefined1 local_1d8 [24];
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined4 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  char local_128 [264];
  
  local_208 = local_1d8;
  if (in_AL != '\0') {
    local_1a8 = in_XMM0_Da;
    local_198 = in_XMM1_Qa;
    local_188 = in_XMM2_Qa;
    local_178 = in_XMM3_Qa;
    local_168 = in_XMM4_Qa;
    local_158 = in_XMM5_Qa;
    local_148 = in_XMM6_Qa;
    local_138 = in_XMM7_Qa;
  }
  local_238.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.super__Vector_impl_data.
  _M_start = (char *)0x0;
  local_238.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_238.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1f8 = 0x3000000018;
  local_210 = &dynmsg.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.
               super__Vector_impl_data._M_finish;
  local_218 = 0x3000000018;
  __s = local_128;
  local_1f0 = local_210;
  local_1e8 = local_208;
  local_1c0 = in_RCX;
  local_1b8 = in_R8;
  local_1b0 = in_R9;
  iVar1 = vsnprintf(__s,0x100,fmt,&local_1f8);
  if (0xff < iVar1) {
    std::vector<char,_al::allocator<char,_1UL>_>::resize(&local_238,(ulong)(iVar1 + 1));
    __s = local_238.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.
          super__Vector_impl_data._M_start;
    vsnprintf(local_238.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.
              super__Vector_impl_data._M_start,
              (long)local_238.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_238.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.
                    super__Vector_impl_data._M_start,fmt,&local_218);
  }
  if ((int)level <= (int)gLogLevel) {
    fputs(__s,(FILE *)logfile);
    fflush((FILE *)logfile);
  }
  if (local_238.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    al_free(local_238.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.
            super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void al_print(LogLevel level, FILE *logfile, const char *fmt, ...)
{
    al::vector<char> dynmsg;
    char stcmsg[256];
    char *str{stcmsg};

    va_list args, args2;
    va_start(args, fmt);
    va_copy(args2, args);
    int msglen{std::vsnprintf(str, sizeof(stcmsg), fmt, args)};
    if UNLIKELY(msglen >= 0 && static_cast<size_t>(msglen) >= sizeof(stcmsg))
    {
        dynmsg.resize(static_cast<size_t>(msglen) + 1u);
        str = dynmsg.data();
        msglen = std::vsnprintf(str, dynmsg.size(), fmt, args2);
    }